

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<FVoxel_*,_FVoxel_*>::~TDeletingArray(TDeletingArray<FVoxel_*,_FVoxel_*> *this)

{
  FVoxel *this_00;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (this->super_TArray<FVoxel_*,_FVoxel_*>).Count;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      this_00 = (this->super_TArray<FVoxel_*,_FVoxel_*>).Array[uVar2];
      if (this_00 != (FVoxel *)0x0) {
        FVoxel::~FVoxel(this_00);
        operator_delete(this_00,0x158);
        uVar1 = (this->super_TArray<FVoxel_*,_FVoxel_*>).Count;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  TArray<FVoxel_*,_FVoxel_*>::~TArray(&this->super_TArray<FVoxel_*,_FVoxel_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}